

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TestSuite *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_e0 [24];
  long *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  TestSuite *local_10;
  
  local_10 = in_RSI;
  TestSuite::Passed((TestSuite *)0x5a6390);
  __rhs = &local_b0;
  FormatBool_abi_cxx11_
            ((StreamingListener *)in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::operator+((char *)in_stack_ffffffffffffff18,__rhs);
  std::operator+(in_stack_ffffffffffffff18,(char *)__rhs);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          TestSuite::elapsed_time(local_10);
  StreamableToString<long>(in_stack_ffffffffffffff38);
  std::operator+(in_stack_ffffffffffffff48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  std::operator+(__lhs,(char *)__rhs);
  SendLn((StreamingListener *)__rhs,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) override {
    SendLn("event=TestCaseEnd&passed=" + FormatBool(test_case.Passed()) +
           "&elapsed_time=" + StreamableToString(test_case.elapsed_time()) +
           "ms");
  }